

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::next_alternative(depth_first_traverser *this)

{
  reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
  i;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  local_20 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_18 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_20 != local_18) {
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>>,__gnu_cxx::__ops::_Iter_pred<clipp::group::depth_first_traverser::next_alternative()::_lambda(clipp::group::depth_first_traverser::context_const&)_1_>>
              (&local_28);
    if (local_28 !=
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (local_28 !=
          (this->stack_).
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_28;
      }
      next_sibling(this);
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        next_alternative() {
            if(stack_.empty()) return *this;

            //find first exclusive group (from the top of the stack!)
            auto i = std::find_if(stack_.rbegin(), stack_.rend(),
                [](const context& c) { return c.parent->exclusive(); });
            if(i == stack_.rend()) return *this;

            stack_.erase(i.base(), stack_.end());
            next_sibling();
            return *this;
        }